

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpTokens.cpp
# Opt level: O3

bool __thiscall
glslang::TPpContext::TokenStream::peekTokenizedPasting(TokenStream *this,bool lastTokenPastes)

{
  pointer pTVar1;
  pointer pTVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar4 = this->currentPos;
  pTVar2 = (this->stream).
           super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
           .
           super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->stream).
                 super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                 .
                 super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) *
          0x6db6db6db6db6db7;
  uVar6 = uVar4;
  if (uVar4 < uVar5) {
    pTVar1 = pTVar2 + uVar4;
    uVar3 = uVar4;
    do {
      if (pTVar1->atom != 0x20) {
        uVar6 = uVar3;
        if (pTVar1->atom == 0x97) {
          bVar7 = true;
          goto LAB_00444dff;
        }
        break;
      }
      uVar3 = uVar3 + 1;
      this->currentPos = uVar3;
      pTVar1 = pTVar1 + 1;
      uVar6 = uVar5;
    } while (uVar5 - uVar3 != 0);
  }
  uVar4 = uVar6;
  if (!lastTokenPastes) {
    return false;
  }
  bVar7 = true;
  if (uVar4 < uVar5) {
    if (pTVar2[uVar4].atom == 0x20) {
      pTVar2 = pTVar2 + uVar4;
      uVar6 = uVar4;
      do {
        uVar6 = uVar6 + 1;
        pTVar2 = pTVar2 + 1;
        if (uVar5 - uVar6 == 0) break;
      } while (pTVar2->atom == 0x20);
      bVar7 = uVar5 <= uVar6;
    }
    else {
      bVar7 = false;
    }
  }
LAB_00444dff:
  this->currentPos = uVar4;
  return bVar7;
}

Assistant:

bool TPpContext::TokenStream::peekTokenizedPasting(bool lastTokenPastes)
{
    // 1. preceding ##?

    size_t savePos = currentPos;
    // skip white space
    while (peekToken(' '))
        ++currentPos;
    if (peekToken(PpAtomPaste)) {
        currentPos = savePos;
        return true;
    }

    // 2. last token and we've been told after this there will be a ##

    if (! lastTokenPastes)
        return false;
    // Getting here means the last token will be pasted, after this

    // Are we at the last non-whitespace token?
    savePos = currentPos;
    bool moreTokens = false;
    do {
        if (atEnd())
            break;
        if (!peekToken(' ')) {
            moreTokens = true;
            break;
        }
        ++currentPos;
    } while (true);
    currentPos = savePos;

    return !moreTokens;
}